

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

void Abc_NtkManCutStop(Abc_ManCut_t *p)

{
  Abc_ManCut_t *p_local;
  
  Vec_PtrFree(p->vNodeLeaves);
  Vec_PtrFree(p->vConeLeaves);
  Vec_PtrFree(p->vVisited);
  Vec_VecFree(p->vLevels);
  Vec_PtrFree(p->vNodesTfo);
  if (p != (Abc_ManCut_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_NtkManCutStop( Abc_ManCut_t * p )
{
    Vec_PtrFree( p->vNodeLeaves );
    Vec_PtrFree( p->vConeLeaves );
    Vec_PtrFree( p->vVisited    );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vNodesTfo );
    ABC_FREE( p );
}